

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

intptr_t sysbvm_methodDictionary_scanFor(sysbvm_tuple_t dictionary,sysbvm_tuple_t element)

{
  long lVar1;
  sysbvm_tuple_t sVar2;
  _Bool _Var3;
  size_t sVar4;
  ulong uVar5;
  sysbvm_tuple_t dictionaryKey_1;
  size_t i_1;
  sysbvm_tuple_t dictionaryKey;
  size_t i;
  size_t hashIndex;
  sysbvm_array_t *storage;
  size_t capacity;
  sysbvm_dictionary_t *dictionaryObject;
  sysbvm_tuple_t element_local;
  sysbvm_tuple_t dictionary_local;
  
  _Var3 = sysbvm_tuple_isNonNullPointer(dictionary);
  if (_Var3) {
    sVar4 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(dictionary + 0x18));
    uVar5 = sVar4 >> 1;
    if (uVar5 != 0) {
      lVar1 = *(long *)(dictionary + 0x18);
      sVar4 = sysbvm_tuple_identityHash(element);
      for (dictionaryKey = sVar4 % uVar5; dictionaryKey < uVar5; dictionaryKey = dictionaryKey + 1)
      {
        sVar2 = *(sysbvm_tuple_t *)(lVar1 + 0x10 + dictionaryKey * 0x10);
        if ((sVar2 == 0x3f) || (_Var3 = sysbvm_tuple_identityEquals(element,sVar2), _Var3)) {
          return dictionaryKey;
        }
      }
      for (dictionaryKey_1 = 0; dictionaryKey_1 < sVar4 % uVar5;
          dictionaryKey_1 = dictionaryKey_1 + 1) {
        sVar2 = *(sysbvm_tuple_t *)(lVar1 + 0x10 + dictionaryKey_1 * 0x10);
        if ((sVar2 == 0x3f) || (_Var3 = sysbvm_tuple_identityEquals(element,sVar2), _Var3)) {
          return dictionaryKey_1;
        }
      }
    }
  }
  return -1;
}

Assistant:

static intptr_t sysbvm_methodDictionary_scanFor(sysbvm_tuple_t dictionary, sysbvm_tuple_t element)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return -1;

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
    if(capacity == 0)
        return -1;

    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    size_t hashIndex = sysbvm_tuple_identityHash(element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        sysbvm_tuple_t dictionaryKey = storage->elements[i*2];
        if(dictionaryKey == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE || sysbvm_tuple_identityEquals(element, dictionaryKey))
            return (intptr_t)i;
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        sysbvm_tuple_t dictionaryKey = storage->elements[i*2];
        if(dictionaryKey == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE || sysbvm_tuple_identityEquals(element, dictionaryKey))
            return (intptr_t)i;
    }

    return -1;
}